

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O2

void __thiscall SSTable::fillData(SSTable *this,SSTableData *new_data)

{
  pointer pSVar1;
  pointer pSVar2;
  longlong lVar3;
  longlong lVar4;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *this_00;
  SSTableIndex *pSVar5;
  SSTableHeader *pSVar6;
  iterator __begin1;
  pointer pSVar7;
  iterator __end1;
  size_t sVar8;
  SSTableIndexItem local_40;
  
  this_00 = (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)operator_new(0x18);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector(this_00,new_data);
  this->data = this_00;
  pSVar1 = (this_00->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this_00->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar3 = pSVar1->key;
  lVar4 = pSVar2[-1].key;
  pSVar5 = (SSTableIndex *)operator_new(0x18);
  (pSVar5->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar5->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar5->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->index = pSVar5;
  sVar8 = 0x20;
  for (pSVar7 = pSVar1; pSVar7 != pSVar2; pSVar7 = pSVar7 + 1) {
    local_40.key = pSVar7->key;
    local_40.offset = sVar8;
    std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::emplace_back<SSTableIndexItem>
              (this->index,&local_40);
    sVar8 = sVar8 + (pSVar7->value)._M_string_length + 0x19;
  }
  pSVar6 = (SSTableHeader *)operator_new(0x20);
  pSVar6->index_offset = sVar8;
  pSVar6->entries_count = (long)pSVar2 - (long)pSVar1 >> 6;
  pSVar6->key_min = lVar3;
  pSVar6->key_max = lVar4;
  this->header = pSVar6;
  return;
}

Assistant:

void SSTable::fillData(SSTableData &new_data) {
    data = new SSTableData{new_data};
    long long key_min = 0, key_max = 0;
    size_t file_offset = 0, entries_count = data->size();
    // Determining header.
    key_min = data->begin()->key;
    key_max = data->rbegin()->key;
    file_offset = 32; // Header use 32 bytes.
    size_t item_bytes = 0;
    index = new SSTableIndex{};
    for (const auto &item:*data) {
        index->push_back({item.key, file_offset});
        item_bytes = size_of_entry(item);
        file_offset += item_bytes;
    }
    header = new SSTableHeader{file_offset, entries_count, key_min, key_max};
}